

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * openjtalk_getFullVoicePath(OpenJTalk *oj,char *path,char *buffer)

{
  char *pcVar1;
  char *pcVar2;
  char temp [260];
  char acStack_118 [264];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return (char *)0x0;
  }
  if (path != (char *)0x0) {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (*path == '\0') {
      oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
      return (char *)0x0;
    }
    if (buffer != (char *)0x0) {
      pcVar1 = u8tou8_path(path,buffer);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar1 = make_voice_path(oj,acStack_118);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar2 = u8tou8_path(pcVar1,buffer);
      free(pcVar1);
      return pcVar2;
    }
  }
  oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getFullVoicePath(OpenJTalk *oj, const char *path, char *buffer)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}
	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlen(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}

	if (!buffer)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u8tou8_path(path, buffer);
#else
	char *res = u8tou8_path(path, buffer);
#endif
	if (!res)
	{
		return NULL;
	}

	char *temp2 = make_voice_path(oj, temp);
	if (!temp2)
	{
		return NULL;
	}

#if defined(_WIN32)
	char *res2 = u8tou8_path(temp2, buffer);
#else
	char *res2 = u8tou8_path(temp2, buffer);
#endif
	free(temp2);
	return res2;
}